

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::symbol_codec::assemble_output_buf(symbol_codec *this,bool support_arith)

{
  short sVar1;
  output_symbol *poVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  uint bits;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  this->m_total_bits_written = 0;
  uVar7 = 0;
  if ((int)CONCAT71(in_register_00000031,support_arith) != 0) {
    if ((this->m_arith_output_buf).m_size == 0) {
      uVar7 = 0;
      put_bits(this,0,1);
    }
    else {
      put_bits(this,1,1);
      this->m_arith_value = 0;
      this->m_arith_length = 0xffffffff;
      uVar7 = 4;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar3 = (uint)(this->m_arith_output_buf).m_p[lVar8];
        this->m_arith_value = this->m_arith_value << 8 | uVar3;
        put_bits(this,uVar3,8);
      }
    }
  }
  for (uVar9 = 0; uVar9 < (this->m_output_syms).m_size; uVar9 = uVar9 + 1) {
    poVar2 = (this->m_output_syms).m_p;
    sVar1 = poVar2[uVar9].m_num_bits;
    if (sVar1 == -1) {
      uVar3 = this->m_arith_length;
      if (uVar3 < 0x1000000) {
        do {
          bits = 0;
          if (uVar7 < (this->m_arith_output_buf).m_size) {
            uVar5 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            bits = (uint)(this->m_arith_output_buf).m_p[uVar5];
          }
          put_bits(this,bits,8);
          uVar4 = this->m_arith_value << 8 | bits;
          this->m_arith_value = uVar4;
          uVar3 = this->m_arith_length << 8;
          this->m_arith_length = uVar3;
        } while (uVar3 < 0x1000000);
      }
      else {
        uVar4 = this->m_arith_value;
      }
      uVar6 = (uVar3 >> 0xb) * (uint)poVar2[uVar9].m_arith_prob0;
      bVar10 = uVar6 <= uVar4;
      if (bVar10) {
        this->m_arith_value = uVar4 - uVar6;
        uVar6 = uVar3 - uVar6;
      }
      this->m_arith_length = uVar6;
      if (poVar2[uVar9].m_bits != (uint)bVar10) {
        crnlib_assert("bit == sym.m_bits",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_symbol_codec.cpp"
                      ,0x5c3);
      }
    }
    else if (sVar1 == -2) {
      put_bits_align_to_byte(this);
    }
    else {
      put_bits(this,poVar2[uVar9].m_bits,(int)sVar1);
    }
  }
  flush_bits(this);
  return;
}

Assistant:

void symbol_codec::assemble_output_buf(bool support_arith)
    {
        m_total_bits_written = 0;

        uint arith_buf_ofs = 0;

        if (support_arith)
        {
            if (m_arith_output_buf.size())
            {
                put_bits(1, 1);

                m_arith_length = cSymbolCodecArithMaxLen;
                m_arith_value = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint c = m_arith_output_buf[arith_buf_ofs++];
                    m_arith_value = (m_arith_value << 8) | c;
                    put_bits(c, 8);
                }
            }
            else
            {
                put_bits(0, 1);
            }
        }

        for (uint sym_index = 0; sym_index < m_output_syms.size(); sym_index++)
        {
            const output_symbol& sym = m_output_syms[sym_index];

            if (sym.m_num_bits == output_symbol::cAlignToByteSym)
            {
                put_bits_align_to_byte();
            }
            else if (sym.m_num_bits == output_symbol::cArithSym)
            {
                if (m_arith_length < cSymbolCodecArithMinLen)
                {
                    do
                    {
                        const uint c = (arith_buf_ofs < m_arith_output_buf.size()) ? m_arith_output_buf[arith_buf_ofs++] : 0;
                        put_bits(c, 8);
                        m_arith_value = (m_arith_value << 8) | c;
                    } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
                }

                //uint x = gArithProbMulTab[sym.m_arith_prob0 >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
                uint x = sym.m_arith_prob0 * (m_arith_length >> cSymbolCodecArithProbBits);
                uint bit = (m_arith_value >= x);

                if (bit == 0)
                {
                    m_arith_length = x;
                }
                else
                {
                    m_arith_value -= x;
                    m_arith_length -= x;
                }

                CRNLIB_VERIFY(bit == sym.m_bits);
            }
            else
            {
                put_bits(sym.m_bits, sym.m_num_bits);
            }
        }

        flush_bits();
    }